

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAnimationKeyFrames
          (OgreXmlSerializer *this,Animation *anim,VertexAnimationTrack *dest)

{
  string *psVar1;
  pointer *ppTVar2;
  iterator __position;
  int iVar3;
  string *psVar4;
  Logger *this_00;
  runtime_error *this_01;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_228;
  TransformKeyFrame local_1fc;
  vector<Assimp::Ogre::TransformKeyFrame,std::allocator<Assimp::Ogre::TransformKeyFrame>> *local_1d0
  ;
  long *local_1c8;
  long local_1b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  NextNode_abi_cxx11_(this);
  psVar1 = &this->m_currentNodeName;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar3 != 0) {
    return;
  }
  local_1d0 = (vector<Assimp::Ogre::TransformKeyFrame,std::allocator<Assimp::Ogre::TransformKeyFrame>>
               *)&dest->transformKeyFrames;
  do {
    TransformKeyFrame::TransformKeyFrame(&local_1fc);
    local_1fc.timePos = ReadAttribute<float>(this,"time");
    while( true ) {
      NextNode_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) &&
         (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) break;
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar3 == 0) {
        local_1fc.position.x = ReadAttribute<float>(this,"x");
        local_1fc.position.y = ReadAttribute<float>(this,"y");
        local_1fc.position.z = ReadAttribute<float>(this,"z");
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar3 == 0) {
          fVar5 = ReadAttribute<float>(this,"angle");
          psVar4 = NextNode_abi_cxx11_(this);
          iVar3 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar3 != 0) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(local_1a8,"No axis specified for keyframe rotation in animation ",
                           &anim->name);
            std::runtime_error::runtime_error(this_01,(string *)local_1a8);
            *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
            __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          local_228 = ReadAttribute<float>(this,"x");
          fVar6 = ReadAttribute<float>(this,"y");
          fVar7 = ReadAttribute<float>(this,"z");
          if (((ABS(local_228) <= 1e-06) && (ABS(fVar6) <= 1e-06)) && (ABS(fVar7) <= 1e-06)) {
            local_228 = 1.0;
            if ((fVar5 != 0.0) || (NAN(fVar5))) {
              this_00 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[67]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,
                         (char (*) [67])
                         "Found invalid a key frame with a zero rotation axis in animation: ");
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(anim->name)._M_dataplus._M_p,
                         (anim->name)._M_string_length);
              std::__cxx11::stringbuf::str();
              Logger::warn(this_00,(char *)local_1c8);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
            }
          }
          fVar8 = fVar7 * fVar7 + local_228 * local_228 + fVar6 * fVar6;
          if (fVar8 < 0.0) {
            fVar8 = sqrtf(fVar8);
          }
          else {
            fVar8 = SQRT(fVar8);
          }
          fVar8 = 1.0 / fVar8;
          fVar9 = sinf(fVar5 * 0.5);
          local_1fc.rotation.w = cosf(fVar5 * 0.5);
          local_1fc.rotation.x = local_228 * fVar8 * fVar9;
          local_1fc.rotation.y = fVar6 * fVar8 * fVar9;
          local_1fc.rotation.z = fVar7 * fVar8 * fVar9;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar3 == 0) {
            local_1fc.scale.x = ReadAttribute<float>(this,"x");
            local_1fc.scale.y = ReadAttribute<float>(this,"y");
            local_1fc.scale.z = ReadAttribute<float>(this,"z");
          }
        }
      }
    }
    __position._M_current =
         (dest->transformKeyFrames).
         super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (dest->transformKeyFrames).
        super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::Ogre::TransformKeyFrame,std::allocator<Assimp::Ogre::TransformKeyFrame>>::
      _M_realloc_insert<Assimp::Ogre::TransformKeyFrame_const&>(local_1d0,__position,&local_1fc);
    }
    else {
      *(ulong *)&((__position._M_current)->position).z =
           CONCAT44(local_1fc.scale.x,local_1fc.position.z);
      ((__position._M_current)->scale).y = local_1fc.scale.y;
      ((__position._M_current)->scale).z = local_1fc.scale.z;
      *(ulong *)&((__position._M_current)->rotation).z =
           CONCAT44(local_1fc.position.x,local_1fc.rotation.z);
      ((__position._M_current)->position).y = local_1fc.position.y;
      ((__position._M_current)->position).z = local_1fc.position.z;
      (__position._M_current)->timePos = local_1fc.timePos;
      ((__position._M_current)->rotation).w = local_1fc.rotation.w;
      ((__position._M_current)->rotation).x = local_1fc.rotation.x;
      ((__position._M_current)->rotation).y = local_1fc.rotation.y;
      ppTVar2 = &(dest->transformKeyFrames).
                 super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar2 = *ppTVar2 + 1;
    }
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
  } while (iVar3 == 0);
  return;
}

Assistant:

void OgreXmlSerializer::ReadAnimationKeyFrames(Animation *anim, VertexAnimationTrack *dest)
{
    const aiVector3D zeroVec(0.f, 0.f, 0.f);

    NextNode();
    while(m_currentNodeName == nnKeyFrame)
    {
        TransformKeyFrame keyframe;
        keyframe.timePos = ReadAttribute<float>("time");

        NextNode();
        while(m_currentNodeName == nnTranslate || m_currentNodeName == nnRotate || m_currentNodeName == nnScale)
        {
            if (m_currentNodeName == nnTranslate)
            {
                keyframe.position.x = ReadAttribute<float>(anX);
                keyframe.position.y = ReadAttribute<float>(anY);
                keyframe.position.z = ReadAttribute<float>(anZ);
            }
            else if (m_currentNodeName == nnRotate)
            {
                float angle = ReadAttribute<float>("angle");

                if (NextNode() != nnAxis) {
                    throw DeadlyImportError("No axis specified for keyframe rotation in animation " + anim->name);
                }

                aiVector3D axis;
                axis.x = ReadAttribute<float>(anX);
                axis.y = ReadAttribute<float>(anY);
                axis.z = ReadAttribute<float>(anZ);
                if (axis.Equal(zeroVec))
                {
                    axis.x = 1.0f;
                    if (angle != 0) {
                        ASSIMP_LOG_WARN_F("Found invalid a key frame with a zero rotation axis in animation: ", anim->name);
                    }
                }
                keyframe.rotation = aiQuaternion(axis, angle);
            }
            else if (m_currentNodeName == nnScale)
            {
                keyframe.scale.x = ReadAttribute<float>(anX);
                keyframe.scale.y = ReadAttribute<float>(anY);
                keyframe.scale.z = ReadAttribute<float>(anZ);
            }

            NextNode();
        }

        dest->transformKeyFrames.push_back(keyframe);
    }
}